

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O3

int ply_add_scalar_property(p_ply ply,char *name,e_ply_type type)

{
  size_t sVar1;
  char *__dest;
  int iVar2;
  
  sVar1 = strlen(name);
  if (((int)type < 0x10) && (sVar1 < 0x100)) {
    __dest = (char *)ply_grow_array(ply,&ply->element[ply->nelements + -1].property,
                                    &ply->element[ply->nelements + -1].nproperties,0x128);
    if (__dest == (char *)0x0) {
      iVar2 = 0;
    }
    else {
      *__dest = '\0';
      __dest[0x100] = -1;
      __dest[0x101] = -1;
      __dest[0x102] = -1;
      __dest[0x103] = -1;
      __dest[0x104] = -1;
      __dest[0x105] = -1;
      __dest[0x106] = -1;
      __dest[0x107] = -1;
      __dest[0x108] = -1;
      __dest[0x109] = -1;
      __dest[0x10a] = -1;
      __dest[0x10b] = -1;
      __dest[0x120] = '\0';
      __dest[0x121] = '\0';
      __dest[0x122] = '\0';
      __dest[0x123] = '\0';
      __dest[0x124] = '\0';
      __dest[0x125] = '\0';
      __dest[0x126] = '\0';
      __dest[0x127] = '\0';
      __dest[0x110] = '\0';
      __dest[0x111] = '\0';
      __dest[0x112] = '\0';
      __dest[0x113] = '\0';
      __dest[0x114] = '\0';
      __dest[0x115] = '\0';
      __dest[0x116] = '\0';
      __dest[0x117] = '\0';
      __dest[0x118] = '\0';
      __dest[0x119] = '\0';
      __dest[0x11a] = '\0';
      __dest[0x11b] = '\0';
      __dest[0x11c] = '\0';
      __dest[0x11d] = '\0';
      __dest[0x11e] = '\0';
      __dest[0x11f] = '\0';
      strcpy(__dest,name);
      *(e_ply_type *)(__dest + 0x100) = type;
      iVar2 = 1;
    }
  }
  else {
    iVar2 = 0;
    ply_ferror(ply,"Invalid arguments");
  }
  return iVar2;
}

Assistant:

int ply_add_scalar_property(p_ply ply, const char *name, e_ply_type type) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(name && strlen(name) < WORDSIZE);
    assert(type < PLY_LIST);
    if (strlen(name) >= WORDSIZE || type >= PLY_LIST) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    element = &ply->element[ply->nelements - 1];
    property = ply_grow_property(ply, element);
    if (!property) return 0;
    strcpy(property->name, name);
    property->type = type;
    return 1;
}